

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  int iVar39;
  ulong uVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  GridSOA *pGVar45;
  GridSOA *pGVar46;
  Geometry *pGVar47;
  ulong *puVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar74;
  undefined1 auVar73 [32];
  undefined1 auVar75 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  float fVar110;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar128 [32];
  float old_t;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  GridSOA *local_cb8;
  ulong local_cb0;
  ulong local_ca8;
  undefined1 local_ca0 [32];
  ulong local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  float local_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  RTCFilterFunctionNArguments local_bf0;
  Geometry *local_bc0;
  undefined1 auStack_bb8 [24];
  undefined1 local_ba0 [32];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [32];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  GridSOA **local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar76 [16];
  
  puVar48 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar105._4_4_ = uVar1;
  auVar105._0_4_ = uVar1;
  auVar105._8_4_ = uVar1;
  auVar105._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar111._4_4_ = uVar1;
  auVar111._0_4_ = uVar1;
  auVar111._8_4_ = uVar1;
  auVar111._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar21 = fVar2 * 0.99999964;
  fVar93 = fVar3 * 0.99999964;
  fVar22 = fVar87 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar87 = fVar87 * 1.0000004;
  local_c68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar51 = local_c68 ^ 0x10;
  iVar39 = (tray->tnear).field_0.i[k];
  auVar75._4_4_ = iVar39;
  auVar75._0_4_ = iVar39;
  auVar75._8_4_ = iVar39;
  auVar75._12_4_ = iVar39;
  iVar39 = (tray->tfar).field_0.i[k];
  auVar84._4_4_ = iVar39;
  auVar84._0_4_ = iVar39;
  auVar84._8_4_ = iVar39;
  auVar84._12_4_ = iVar39;
  iVar39 = 1 << ((uint)k & 0x1f);
  auVar55._4_4_ = iVar39;
  auVar55._0_4_ = iVar39;
  auVar55._8_4_ = iVar39;
  auVar55._12_4_ = iVar39;
  auVar55._16_4_ = iVar39;
  auVar55._20_4_ = iVar39;
  auVar55._24_4_ = iVar39;
  auVar55._28_4_ = iVar39;
  auVar86 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar55 = vpand_avx2(auVar55,auVar86);
  local_ae0 = vpcmpeqd_avx2(auVar55,auVar86);
  bVar53 = true;
  fVar94 = fVar87;
  fVar95 = fVar87;
  fVar96 = fVar87;
  fVar97 = fVar93;
  fVar98 = fVar93;
  fVar74 = fVar93;
  local_c10 = fVar87;
  fStack_c0c = fVar87;
  fStack_c08 = fVar87;
  fStack_c04 = fVar87;
  local_c00 = fVar93;
  fStack_bfc = fVar93;
  fStack_bf8 = fVar93;
  fStack_bf4 = fVar93;
  do {
    uVar44 = puVar48[-1];
    puVar48 = puVar48 + -1;
    while ((uVar44 & 8) == 0) {
      auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + local_c68),auVar105);
      auVar54._0_4_ = fVar21 * auVar23._0_4_;
      auVar54._4_4_ = fVar21 * auVar23._4_4_;
      auVar54._8_4_ = fVar21 * auVar23._8_4_;
      auVar54._12_4_ = fVar21 * auVar23._12_4_;
      auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar50),auVar108);
      auVar59._0_4_ = fVar93 * auVar23._0_4_;
      auVar59._4_4_ = fVar97 * auVar23._4_4_;
      auVar59._8_4_ = fVar98 * auVar23._8_4_;
      auVar59._12_4_ = fVar74 * auVar23._12_4_;
      auVar23 = vmaxps_avx(auVar54,auVar59);
      auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar49),auVar111);
      auVar60._0_4_ = fVar22 * auVar54._0_4_;
      auVar60._4_4_ = fVar22 * auVar54._4_4_;
      auVar60._8_4_ = fVar22 * auVar54._8_4_;
      auVar60._12_4_ = fVar22 * auVar54._12_4_;
      auVar54 = vmaxps_avx(auVar60,auVar75);
      auVar23 = vmaxps_avx(auVar23,auVar54);
      auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar51),auVar105);
      auVar61._0_4_ = fVar2 * auVar54._0_4_;
      auVar61._4_4_ = fVar2 * auVar54._4_4_;
      auVar61._8_4_ = fVar2 * auVar54._8_4_;
      auVar61._12_4_ = fVar2 * auVar54._12_4_;
      auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar50 ^ 0x10)),auVar108);
      auVar64._0_4_ = fVar3 * auVar54._0_4_;
      auVar64._4_4_ = fVar3 * auVar54._4_4_;
      auVar64._8_4_ = fVar3 * auVar54._8_4_;
      auVar64._12_4_ = fVar3 * auVar54._12_4_;
      auVar54 = vminps_avx(auVar61,auVar64);
      auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar49 ^ 0x10)),auVar111);
      auVar65._0_4_ = fVar87 * auVar59._0_4_;
      auVar65._4_4_ = fVar94 * auVar59._4_4_;
      auVar65._8_4_ = fVar95 * auVar59._8_4_;
      auVar65._12_4_ = fVar96 * auVar59._12_4_;
      auVar59 = vminps_avx(auVar65,auVar84);
      auVar54 = vminps_avx(auVar54,auVar59);
      auVar23 = vcmpps_avx(auVar23,auVar54,2);
      uVar41 = vmovmskps_avx(auVar23);
      if (uVar41 == 0) goto LAB_00591337;
      uVar41 = uVar41 & 0xff;
      uVar40 = uVar44 & 0xfffffffffffffff0;
      lVar42 = 0;
      for (uVar44 = (ulong)uVar41; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar42 = lVar42 + 1;
      }
      uVar44 = *(ulong *)(uVar40 + lVar42 * 8);
      uVar41 = uVar41 - 1 & uVar41;
      uVar43 = (ulong)uVar41;
      if (uVar41 != 0) {
        *puVar48 = uVar44;
        lVar42 = 0;
        for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        uVar41 = uVar41 - 1 & uVar41;
        uVar43 = (ulong)uVar41;
        bVar52 = uVar41 == 0;
        while( true ) {
          puVar48 = puVar48 + 1;
          uVar44 = *(ulong *)(uVar40 + lVar42 * 8);
          if (bVar52) break;
          *puVar48 = uVar44;
          lVar42 = 0;
          for (uVar44 = uVar43; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar42 = lVar42 + 1;
          }
          uVar43 = uVar43 - 1 & uVar43;
          bVar52 = uVar43 == 0;
        }
      }
    }
    if (((uint)uVar44 & 0xf) == 8) {
      pGVar45 = (pre->super_Precalculations).grid;
      uVar41 = *(uint *)(pGVar45 + 0xc);
      local_cb0 = (ulong)uVar41;
      uVar4 = *(uint *)(pGVar45 + 0x10);
      local_ca8 = (ulong)uVar4;
      uVar5 = *(uint *)(pGVar45 + 0x24);
      uVar44 = uVar44 >> 4;
      lVar42 = uVar44 * 4 + (ulong)uVar5;
      auVar23 = *(undefined1 (*) [16])(pGVar45 + local_cb0 * 4 + lVar42 + 0x2c);
      auVar54 = auVar23;
      if (2 < local_ca8) {
        auVar54 = *(undefined1 (*) [16])(pGVar45 + local_cb0 * 8 + uVar44 * 4 + (ulong)uVar5 + 0x2c)
        ;
      }
      auVar59 = *(undefined1 (*) [16])(pGVar45 + uVar44 * 4 + (ulong)uVar5 + 0x2c);
      if (local_cb0 == 2) {
        auVar59 = vshufps_avx(auVar59,auVar59,0x54);
        auVar23 = vshufps_avx(auVar23,auVar23,0x54);
        auVar54 = vshufps_avx(auVar54,auVar54,0x54);
      }
      uVar44 = (ulong)*(uint *)(pGVar45 + 0x14);
      pGVar46 = pGVar45 + uVar44 * 4 + lVar42 + 0x2c;
      auVar60 = *(undefined1 (*) [16])(pGVar46 + local_cb0 * 4);
      auVar61 = auVar60;
      if (2 < uVar4) {
        auVar61 = *(undefined1 (*) [16])(pGVar46 + local_cb0 * 8);
      }
      auVar64 = *(undefined1 (*) [16])pGVar46;
      if (uVar41 == 2) {
        auVar64 = vshufps_avx(auVar64,auVar64,0x54);
        auVar60 = vshufps_avx(auVar60,auVar60,0x54);
        auVar61 = vshufps_avx(auVar61,auVar61,0x54);
      }
      pGVar46 = pGVar45 + uVar44 * 8 + lVar42 + 0x2c;
      auVar65 = *(undefined1 (*) [16])(pGVar46 + local_cb0 * 4);
      auVar76 = auVar65;
      if (2 < uVar4) {
        auVar76 = *(undefined1 (*) [16])(pGVar46 + local_cb0 * 8);
      }
      auVar90._16_16_ = auVar23;
      auVar90._0_16_ = auVar59;
      auVar86._16_16_ = auVar54;
      auVar86._0_16_ = auVar23;
      auVar81 = vunpcklps_avx(auVar90,auVar86);
      auVar55 = vshufps_avx(auVar90,auVar90,0xa5);
      auVar86 = vshufps_avx(auVar86,auVar86,0x94);
      auVar72._16_16_ = auVar60;
      auVar72._0_16_ = auVar64;
      auVar99._16_16_ = auVar61;
      auVar99._0_16_ = auVar60;
      auVar104 = vunpcklps_avx(auVar72,auVar99);
      auVar72 = vshufps_avx(auVar72,auVar72,0xa5);
      auVar90 = vshufps_avx(auVar99,auVar99,0x94);
      auVar23 = *(undefined1 (*) [16])pGVar46;
      if (uVar41 == 2) {
        auVar23 = vshufps_avx(auVar23,auVar23,0x54);
        auVar65 = vshufps_avx(auVar65,auVar65,0x54);
        auVar76 = vshufps_avx(auVar76,auVar76,0x54);
      }
      local_cb8 = pGVar45 + uVar44 * 0xc + lVar42 + 0x2c;
      auVar100._16_16_ = auVar65;
      auVar100._0_16_ = auVar23;
      auVar77._16_16_ = auVar76;
      auVar77._0_16_ = auVar65;
      auVar120 = vunpcklps_avx(auVar100,auVar77);
      auVar99 = vshufps_avx(auVar100,auVar100,0xa5);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar106._4_4_ = uVar1;
      auVar106._0_4_ = uVar1;
      auVar106._8_4_ = uVar1;
      auVar106._12_4_ = uVar1;
      auVar106._16_4_ = uVar1;
      auVar106._20_4_ = uVar1;
      auVar106._24_4_ = uVar1;
      auVar106._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar109._4_4_ = uVar1;
      auVar109._0_4_ = uVar1;
      auVar109._8_4_ = uVar1;
      auVar109._12_4_ = uVar1;
      auVar109._16_4_ = uVar1;
      auVar109._20_4_ = uVar1;
      auVar109._24_4_ = uVar1;
      auVar109._28_4_ = uVar1;
      auVar79 = vshufps_avx(auVar77,auVar77,0x94);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar119._4_4_ = uVar1;
      auVar119._0_4_ = uVar1;
      auVar119._8_4_ = uVar1;
      auVar119._12_4_ = uVar1;
      auVar119._16_4_ = uVar1;
      auVar119._20_4_ = uVar1;
      auVar119._24_4_ = uVar1;
      auVar119._28_4_ = uVar1;
      local_c40 = vsubps_avx(auVar81,auVar106);
      auVar81 = vsubps_avx(auVar104,auVar109);
      auVar104 = vsubps_avx(auVar120,auVar119);
      auVar55 = vsubps_avx(auVar55,auVar106);
      auVar72 = vsubps_avx(auVar72,auVar109);
      auVar120 = vsubps_avx(auVar99,auVar119);
      auVar86 = vsubps_avx(auVar86,auVar106);
      auVar90 = vsubps_avx(auVar90,auVar109);
      auVar79 = vsubps_avx(auVar79,auVar119);
      auVar77 = vsubps_avx(auVar86,local_c40);
      auVar100 = vsubps_avx(auVar90,auVar81);
      auVar106 = vsubps_avx(auVar79,auVar104);
      auVar66._0_4_ = local_c40._0_4_ + auVar86._0_4_;
      auVar66._4_4_ = local_c40._4_4_ + auVar86._4_4_;
      auVar66._8_4_ = local_c40._8_4_ + auVar86._8_4_;
      auVar66._12_4_ = local_c40._12_4_ + auVar86._12_4_;
      auVar66._16_4_ = local_c40._16_4_ + auVar86._16_4_;
      auVar66._20_4_ = local_c40._20_4_ + auVar86._20_4_;
      auVar66._24_4_ = local_c40._24_4_ + auVar86._24_4_;
      auVar66._28_4_ = local_c40._28_4_ + auVar86._28_4_;
      auVar107._0_4_ = auVar90._0_4_ + auVar81._0_4_;
      auVar107._4_4_ = auVar90._4_4_ + auVar81._4_4_;
      auVar107._8_4_ = auVar90._8_4_ + auVar81._8_4_;
      auVar107._12_4_ = auVar90._12_4_ + auVar81._12_4_;
      auVar107._16_4_ = auVar90._16_4_ + auVar81._16_4_;
      auVar107._20_4_ = auVar90._20_4_ + auVar81._20_4_;
      auVar107._24_4_ = auVar90._24_4_ + auVar81._24_4_;
      fVar87 = auVar81._28_4_;
      auVar107._28_4_ = auVar90._28_4_ + fVar87;
      fVar7 = auVar104._0_4_;
      auVar112._0_4_ = auVar79._0_4_ + fVar7;
      fVar8 = auVar104._4_4_;
      auVar112._4_4_ = auVar79._4_4_ + fVar8;
      fVar9 = auVar104._8_4_;
      auVar112._8_4_ = auVar79._8_4_ + fVar9;
      fVar10 = auVar104._12_4_;
      auVar112._12_4_ = auVar79._12_4_ + fVar10;
      fVar11 = auVar104._16_4_;
      auVar112._16_4_ = auVar79._16_4_ + fVar11;
      fVar12 = auVar104._20_4_;
      auVar112._20_4_ = auVar79._20_4_ + fVar12;
      fVar13 = auVar104._24_4_;
      auVar112._24_4_ = auVar79._24_4_ + fVar13;
      auVar112._28_4_ = auVar79._28_4_ + auVar104._28_4_;
      auVar24._4_4_ = auVar107._4_4_ * auVar106._4_4_;
      auVar24._0_4_ = auVar107._0_4_ * auVar106._0_4_;
      auVar24._8_4_ = auVar107._8_4_ * auVar106._8_4_;
      auVar24._12_4_ = auVar107._12_4_ * auVar106._12_4_;
      auVar24._16_4_ = auVar107._16_4_ * auVar106._16_4_;
      auVar24._20_4_ = auVar107._20_4_ * auVar106._20_4_;
      auVar24._24_4_ = auVar107._24_4_ * auVar106._24_4_;
      auVar24._28_4_ = auVar99._28_4_;
      auVar54 = vfmsub231ps_fma(auVar24,auVar100,auVar112);
      auVar25._4_4_ = auVar112._4_4_ * auVar77._4_4_;
      auVar25._0_4_ = auVar112._0_4_ * auVar77._0_4_;
      auVar25._8_4_ = auVar112._8_4_ * auVar77._8_4_;
      auVar25._12_4_ = auVar112._12_4_ * auVar77._12_4_;
      auVar25._16_4_ = auVar112._16_4_ * auVar77._16_4_;
      auVar25._20_4_ = auVar112._20_4_ * auVar77._20_4_;
      auVar25._24_4_ = auVar112._24_4_ * auVar77._24_4_;
      auVar25._28_4_ = auVar112._28_4_;
      auVar23 = vfmsub231ps_fma(auVar25,auVar106,auVar66);
      auVar26._4_4_ = auVar100._4_4_ * auVar66._4_4_;
      auVar26._0_4_ = auVar100._0_4_ * auVar66._0_4_;
      auVar26._8_4_ = auVar100._8_4_ * auVar66._8_4_;
      auVar26._12_4_ = auVar100._12_4_ * auVar66._12_4_;
      auVar26._16_4_ = auVar100._16_4_ * auVar66._16_4_;
      auVar26._20_4_ = auVar100._20_4_ * auVar66._20_4_;
      auVar26._24_4_ = auVar100._24_4_ * auVar66._24_4_;
      auVar26._28_4_ = auVar66._28_4_;
      auVar59 = vfmsub231ps_fma(auVar26,auVar77,auVar107);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar128._4_4_ = uVar1;
      auVar128._0_4_ = uVar1;
      auVar128._8_4_ = uVar1;
      auVar128._12_4_ = uVar1;
      auVar128._16_4_ = uVar1;
      auVar128._20_4_ = uVar1;
      auVar128._24_4_ = uVar1;
      auVar128._28_4_ = uVar1;
      local_aa0 = *(float *)(ray + k * 4 + 0xc0);
      auVar27._4_4_ = local_aa0 * auVar59._4_4_;
      auVar27._0_4_ = local_aa0 * auVar59._0_4_;
      auVar27._8_4_ = local_aa0 * auVar59._8_4_;
      auVar27._12_4_ = local_aa0 * auVar59._12_4_;
      auVar27._16_4_ = local_aa0 * 0.0;
      auVar27._20_4_ = local_aa0 * 0.0;
      auVar27._24_4_ = local_aa0 * 0.0;
      auVar27._28_4_ = auVar106._28_4_;
      auVar23 = vfmadd231ps_fma(auVar27,auVar128,ZEXT1632(auVar23));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar67._4_4_ = uVar1;
      auVar67._0_4_ = uVar1;
      auVar67._8_4_ = uVar1;
      auVar67._12_4_ = uVar1;
      auVar67._16_4_ = uVar1;
      auVar67._20_4_ = uVar1;
      auVar67._24_4_ = uVar1;
      auVar67._28_4_ = uVar1;
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar67,ZEXT1632(auVar54));
      auVar99 = vsubps_avx(auVar81,auVar72);
      auVar24 = vsubps_avx(auVar104,auVar120);
      auVar68._0_4_ = auVar81._0_4_ + auVar72._0_4_;
      auVar68._4_4_ = auVar81._4_4_ + auVar72._4_4_;
      auVar68._8_4_ = auVar81._8_4_ + auVar72._8_4_;
      auVar68._12_4_ = auVar81._12_4_ + auVar72._12_4_;
      auVar68._16_4_ = auVar81._16_4_ + auVar72._16_4_;
      auVar68._20_4_ = auVar81._20_4_ + auVar72._20_4_;
      auVar68._24_4_ = auVar81._24_4_ + auVar72._24_4_;
      auVar68._28_4_ = fVar87 + auVar72._28_4_;
      auVar88._0_4_ = fVar7 + auVar120._0_4_;
      auVar88._4_4_ = fVar8 + auVar120._4_4_;
      auVar88._8_4_ = fVar9 + auVar120._8_4_;
      auVar88._12_4_ = fVar10 + auVar120._12_4_;
      auVar88._16_4_ = fVar11 + auVar120._16_4_;
      auVar88._20_4_ = fVar12 + auVar120._20_4_;
      auVar88._24_4_ = fVar13 + auVar120._24_4_;
      auVar88._28_4_ = auVar104._28_4_ + auVar120._28_4_;
      fVar110 = auVar24._0_4_;
      fVar113 = auVar24._4_4_;
      auVar104._4_4_ = fVar113 * auVar68._4_4_;
      auVar104._0_4_ = fVar110 * auVar68._0_4_;
      fVar114 = auVar24._8_4_;
      auVar104._8_4_ = fVar114 * auVar68._8_4_;
      fVar115 = auVar24._12_4_;
      auVar104._12_4_ = fVar115 * auVar68._12_4_;
      fVar116 = auVar24._16_4_;
      auVar104._16_4_ = fVar116 * auVar68._16_4_;
      fVar117 = auVar24._20_4_;
      auVar104._20_4_ = fVar117 * auVar68._20_4_;
      fVar118 = auVar24._24_4_;
      auVar104._24_4_ = fVar118 * auVar68._24_4_;
      auVar104._28_4_ = fVar87;
      auVar59 = vfmsub231ps_fma(auVar104,auVar99,auVar88);
      auVar104 = vsubps_avx(local_c40,auVar55);
      fVar121 = auVar104._0_4_;
      fVar122 = auVar104._4_4_;
      auVar28._4_4_ = fVar122 * auVar88._4_4_;
      auVar28._0_4_ = fVar121 * auVar88._0_4_;
      fVar123 = auVar104._8_4_;
      auVar28._8_4_ = fVar123 * auVar88._8_4_;
      fVar124 = auVar104._12_4_;
      auVar28._12_4_ = fVar124 * auVar88._12_4_;
      fVar125 = auVar104._16_4_;
      auVar28._16_4_ = fVar125 * auVar88._16_4_;
      fVar126 = auVar104._20_4_;
      auVar28._20_4_ = fVar126 * auVar88._20_4_;
      fVar127 = auVar104._24_4_;
      auVar28._24_4_ = fVar127 * auVar88._24_4_;
      auVar28._28_4_ = auVar88._28_4_;
      auVar101._0_4_ = local_c40._0_4_ + auVar55._0_4_;
      auVar101._4_4_ = local_c40._4_4_ + auVar55._4_4_;
      auVar101._8_4_ = local_c40._8_4_ + auVar55._8_4_;
      auVar101._12_4_ = local_c40._12_4_ + auVar55._12_4_;
      auVar101._16_4_ = local_c40._16_4_ + auVar55._16_4_;
      auVar101._20_4_ = local_c40._20_4_ + auVar55._20_4_;
      auVar101._24_4_ = local_c40._24_4_ + auVar55._24_4_;
      auVar101._28_4_ = local_c40._28_4_ + auVar55._28_4_;
      auVar54 = vfmsub231ps_fma(auVar28,auVar24,auVar101);
      fVar14 = auVar99._0_4_;
      fVar15 = auVar99._4_4_;
      auVar29._4_4_ = auVar101._4_4_ * fVar15;
      auVar29._0_4_ = auVar101._0_4_ * fVar14;
      fVar16 = auVar99._8_4_;
      auVar29._8_4_ = auVar101._8_4_ * fVar16;
      fVar17 = auVar99._12_4_;
      auVar29._12_4_ = auVar101._12_4_ * fVar17;
      fVar18 = auVar99._16_4_;
      auVar29._16_4_ = auVar101._16_4_ * fVar18;
      fVar19 = auVar99._20_4_;
      auVar29._20_4_ = auVar101._20_4_ * fVar19;
      fVar20 = auVar99._24_4_;
      auVar29._24_4_ = auVar101._24_4_ * fVar20;
      auVar29._28_4_ = auVar101._28_4_;
      auVar60 = vfmsub231ps_fma(auVar29,auVar104,auVar68);
      auVar102._0_4_ = auVar60._0_4_ * local_aa0;
      auVar102._4_4_ = auVar60._4_4_ * local_aa0;
      auVar102._8_4_ = auVar60._8_4_ * local_aa0;
      auVar102._12_4_ = auVar60._12_4_ * local_aa0;
      auVar102._16_4_ = local_aa0 * 0.0;
      auVar102._20_4_ = local_aa0 * 0.0;
      auVar102._24_4_ = local_aa0 * 0.0;
      auVar102._28_4_ = 0;
      auVar54 = vfmadd231ps_fma(auVar102,auVar128,ZEXT1632(auVar54));
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar67,ZEXT1632(auVar59));
      auVar25 = vsubps_avx(auVar55,auVar86);
      auVar73._0_4_ = auVar55._0_4_ + auVar86._0_4_;
      auVar73._4_4_ = auVar55._4_4_ + auVar86._4_4_;
      auVar73._8_4_ = auVar55._8_4_ + auVar86._8_4_;
      auVar73._12_4_ = auVar55._12_4_ + auVar86._12_4_;
      auVar73._16_4_ = auVar55._16_4_ + auVar86._16_4_;
      auVar73._20_4_ = auVar55._20_4_ + auVar86._20_4_;
      auVar73._24_4_ = auVar55._24_4_ + auVar86._24_4_;
      auVar73._28_4_ = auVar55._28_4_ + auVar86._28_4_;
      auVar26 = vsubps_avx(auVar72,auVar90);
      auVar62._0_4_ = auVar72._0_4_ + auVar90._0_4_;
      auVar62._4_4_ = auVar72._4_4_ + auVar90._4_4_;
      auVar62._8_4_ = auVar72._8_4_ + auVar90._8_4_;
      auVar62._12_4_ = auVar72._12_4_ + auVar90._12_4_;
      auVar62._16_4_ = auVar72._16_4_ + auVar90._16_4_;
      auVar62._20_4_ = auVar72._20_4_ + auVar90._20_4_;
      auVar62._24_4_ = auVar72._24_4_ + auVar90._24_4_;
      auVar62._28_4_ = auVar72._28_4_ + auVar90._28_4_;
      auVar90 = vsubps_avx(auVar120,auVar79);
      auVar56._0_4_ = auVar79._0_4_ + auVar120._0_4_;
      auVar56._4_4_ = auVar79._4_4_ + auVar120._4_4_;
      auVar56._8_4_ = auVar79._8_4_ + auVar120._8_4_;
      auVar56._12_4_ = auVar79._12_4_ + auVar120._12_4_;
      auVar56._16_4_ = auVar79._16_4_ + auVar120._16_4_;
      auVar56._20_4_ = auVar79._20_4_ + auVar120._20_4_;
      auVar56._24_4_ = auVar79._24_4_ + auVar120._24_4_;
      auVar56._28_4_ = auVar79._28_4_ + auVar120._28_4_;
      auVar78._0_4_ = auVar62._0_4_ * auVar90._0_4_;
      auVar78._4_4_ = auVar62._4_4_ * auVar90._4_4_;
      auVar78._8_4_ = auVar62._8_4_ * auVar90._8_4_;
      auVar78._12_4_ = auVar62._12_4_ * auVar90._12_4_;
      auVar78._16_4_ = auVar62._16_4_ * auVar90._16_4_;
      auVar78._20_4_ = auVar62._20_4_ * auVar90._20_4_;
      auVar78._24_4_ = auVar62._24_4_ * auVar90._24_4_;
      auVar78._28_4_ = 0;
      auVar60 = vfmsub231ps_fma(auVar78,auVar26,auVar56);
      auVar79._4_4_ = auVar56._4_4_ * auVar25._4_4_;
      auVar79._0_4_ = auVar56._0_4_ * auVar25._0_4_;
      auVar79._8_4_ = auVar56._8_4_ * auVar25._8_4_;
      auVar79._12_4_ = auVar56._12_4_ * auVar25._12_4_;
      auVar79._16_4_ = auVar56._16_4_ * auVar25._16_4_;
      auVar79._20_4_ = auVar56._20_4_ * auVar25._20_4_;
      auVar79._24_4_ = auVar56._24_4_ * auVar25._24_4_;
      auVar79._28_4_ = auVar56._28_4_;
      auVar59 = vfmsub231ps_fma(auVar79,auVar90,auVar73);
      auVar120._4_4_ = auVar73._4_4_ * auVar26._4_4_;
      auVar120._0_4_ = auVar73._0_4_ * auVar26._0_4_;
      auVar120._8_4_ = auVar73._8_4_ * auVar26._8_4_;
      auVar120._12_4_ = auVar73._12_4_ * auVar26._12_4_;
      auVar120._16_4_ = auVar73._16_4_ * auVar26._16_4_;
      auVar120._20_4_ = auVar73._20_4_ * auVar26._20_4_;
      auVar120._24_4_ = auVar73._24_4_ * auVar26._24_4_;
      auVar120._28_4_ = auVar73._28_4_;
      auVar61 = vfmsub231ps_fma(auVar120,auVar25,auVar62);
      auVar30._4_4_ = local_aa0 * auVar61._4_4_;
      auVar30._0_4_ = local_aa0 * auVar61._0_4_;
      auVar30._8_4_ = local_aa0 * auVar61._8_4_;
      auVar30._12_4_ = local_aa0 * auVar61._12_4_;
      auVar30._16_4_ = local_aa0 * 0.0;
      auVar30._20_4_ = local_aa0 * 0.0;
      auVar30._24_4_ = local_aa0 * 0.0;
      auVar30._28_4_ = auVar62._28_4_;
      auVar59 = vfmadd231ps_fma(auVar30,auVar128,ZEXT1632(auVar59));
      auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar67,ZEXT1632(auVar60));
      auVar76._0_8_ =
           CONCAT44(auVar59._4_4_ + auVar23._4_4_ + auVar54._4_4_,
                    auVar59._0_4_ + auVar23._0_4_ + auVar54._0_4_);
      auVar76._8_4_ = auVar59._8_4_ + auVar23._8_4_ + auVar54._8_4_;
      auVar76._12_4_ = auVar59._12_4_ + auVar23._12_4_ + auVar54._12_4_;
      auVar79 = ZEXT1632(auVar76);
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57._16_4_ = 0x7fffffff;
      auVar57._20_4_ = 0x7fffffff;
      auVar57._24_4_ = 0x7fffffff;
      auVar57._28_4_ = 0x7fffffff;
      auVar120 = ZEXT1632(auVar23);
      auVar55 = vminps_avx(auVar120,ZEXT1632(auVar54));
      auVar55 = vminps_avx(auVar55,ZEXT1632(auVar59));
      local_ac0 = vandps_avx(auVar79,auVar57);
      fVar87 = local_ac0._0_4_ * 1.1920929e-07;
      fVar93 = local_ac0._4_4_ * 1.1920929e-07;
      auVar31._4_4_ = fVar93;
      auVar31._0_4_ = fVar87;
      fVar94 = local_ac0._8_4_ * 1.1920929e-07;
      auVar31._8_4_ = fVar94;
      fVar95 = local_ac0._12_4_ * 1.1920929e-07;
      auVar31._12_4_ = fVar95;
      fVar96 = local_ac0._16_4_ * 1.1920929e-07;
      auVar31._16_4_ = fVar96;
      fVar97 = local_ac0._20_4_ * 1.1920929e-07;
      auVar31._20_4_ = fVar97;
      fVar98 = local_ac0._24_4_ * 1.1920929e-07;
      auVar31._24_4_ = fVar98;
      auVar31._28_4_ = 0x34000000;
      auVar80._0_8_ = CONCAT44(fVar93,fVar87) ^ 0x8000000080000000;
      auVar80._8_4_ = -fVar94;
      auVar80._12_4_ = -fVar95;
      auVar80._16_4_ = -fVar96;
      auVar80._20_4_ = -fVar97;
      auVar80._24_4_ = -fVar98;
      auVar80._28_4_ = 0xb4000000;
      auVar55 = vcmpps_avx(auVar55,auVar80,5);
      local_ba0 = ZEXT1632(auVar54);
      auVar72 = vmaxps_avx(auVar120,local_ba0);
      auVar86 = vmaxps_avx(auVar72,ZEXT1632(auVar59));
      auVar86 = vcmpps_avx(auVar86,auVar31,2);
      auVar86 = vorps_avx(auVar55,auVar86);
      fVar87 = local_c10;
      fVar94 = fStack_c0c;
      fVar95 = fStack_c08;
      fVar96 = fStack_c04;
      fVar93 = local_c00;
      fVar97 = fStack_bfc;
      fVar98 = fStack_bf8;
      fVar74 = fStack_bf4;
      if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar86 >> 0x7f,0) != '\0') ||
            (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar86 >> 0xbf,0) != '\0') ||
          (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar86[0x1f] < '\0') {
        auVar32._4_4_ = fVar15 * auVar106._4_4_;
        auVar32._0_4_ = fVar14 * auVar106._0_4_;
        auVar32._8_4_ = fVar16 * auVar106._8_4_;
        auVar32._12_4_ = fVar17 * auVar106._12_4_;
        auVar32._16_4_ = fVar18 * auVar106._16_4_;
        auVar32._20_4_ = fVar19 * auVar106._20_4_;
        auVar32._24_4_ = fVar20 * auVar106._24_4_;
        auVar32._28_4_ = auVar55._28_4_;
        auVar33._4_4_ = fVar122 * auVar100._4_4_;
        auVar33._0_4_ = fVar121 * auVar100._0_4_;
        auVar33._8_4_ = fVar123 * auVar100._8_4_;
        auVar33._12_4_ = fVar124 * auVar100._12_4_;
        auVar33._16_4_ = fVar125 * auVar100._16_4_;
        auVar33._20_4_ = fVar126 * auVar100._20_4_;
        auVar33._24_4_ = fVar127 * auVar100._24_4_;
        auVar33._28_4_ = auVar72._28_4_;
        auVar59 = vfmsub213ps_fma(auVar100,auVar24,auVar32);
        auVar34._4_4_ = fVar113 * auVar26._4_4_;
        auVar34._0_4_ = fVar110 * auVar26._0_4_;
        auVar34._8_4_ = fVar114 * auVar26._8_4_;
        auVar34._12_4_ = fVar115 * auVar26._12_4_;
        auVar34._16_4_ = fVar116 * auVar26._16_4_;
        auVar34._20_4_ = fVar117 * auVar26._20_4_;
        auVar34._24_4_ = fVar118 * auVar26._24_4_;
        auVar34._28_4_ = 0x34000000;
        auVar103._0_4_ = fVar121 * auVar90._0_4_;
        auVar103._4_4_ = fVar122 * auVar90._4_4_;
        auVar103._8_4_ = fVar123 * auVar90._8_4_;
        auVar103._12_4_ = fVar124 * auVar90._12_4_;
        auVar103._16_4_ = fVar125 * auVar90._16_4_;
        auVar103._20_4_ = fVar126 * auVar90._20_4_;
        auVar103._24_4_ = fVar127 * auVar90._24_4_;
        auVar103._28_4_ = 0;
        auVar60 = vfmsub213ps_fma(auVar90,auVar99,auVar34);
        auVar55 = vandps_avx(auVar32,auVar57);
        auVar72 = vandps_avx(auVar34,auVar57);
        auVar55 = vcmpps_avx(auVar55,auVar72,1);
        local_980 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar59),auVar55);
        auVar35._4_4_ = fVar15 * auVar25._4_4_;
        auVar35._0_4_ = fVar14 * auVar25._0_4_;
        auVar35._8_4_ = fVar16 * auVar25._8_4_;
        auVar35._12_4_ = fVar17 * auVar25._12_4_;
        auVar35._16_4_ = fVar18 * auVar25._16_4_;
        auVar35._20_4_ = fVar19 * auVar25._20_4_;
        auVar35._24_4_ = fVar20 * auVar25._24_4_;
        auVar35._28_4_ = auVar55._28_4_;
        auVar59 = vfmsub213ps_fma(auVar25,auVar24,auVar103);
        auVar85._0_4_ = auVar77._0_4_ * fVar110;
        auVar85._4_4_ = auVar77._4_4_ * fVar113;
        auVar85._8_4_ = auVar77._8_4_ * fVar114;
        auVar85._12_4_ = auVar77._12_4_ * fVar115;
        auVar85._16_4_ = auVar77._16_4_ * fVar116;
        auVar85._20_4_ = auVar77._20_4_ * fVar117;
        auVar85._24_4_ = auVar77._24_4_ * fVar118;
        auVar85._28_4_ = 0;
        auVar60 = vfmsub213ps_fma(auVar106,auVar104,auVar85);
        auVar55 = vandps_avx(auVar85,auVar57);
        auVar72 = vandps_avx(auVar103,auVar57);
        auVar55 = vcmpps_avx(auVar55,auVar72,1);
        local_960 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar60),auVar55);
        auVar59 = vfmsub213ps_fma(auVar77,auVar99,auVar33);
        auVar60 = vfmsub213ps_fma(auVar26,auVar104,auVar35);
        auVar55 = vandps_avx(auVar33,auVar57);
        auVar72 = vandps_avx(auVar35,auVar57);
        auVar55 = vcmpps_avx(auVar55,auVar72,1);
        local_940 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar59),auVar55);
        auVar59 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
        auVar36._4_4_ = local_940._4_4_ * local_aa0;
        auVar36._0_4_ = local_940._0_4_ * local_aa0;
        auVar36._8_4_ = local_940._8_4_ * local_aa0;
        auVar36._12_4_ = local_940._12_4_ * local_aa0;
        auVar36._16_4_ = local_940._16_4_ * local_aa0;
        auVar36._20_4_ = local_940._20_4_ * local_aa0;
        auVar36._24_4_ = local_940._24_4_ * local_aa0;
        auVar36._28_4_ = auVar86._28_4_;
        auVar60 = vfmadd213ps_fma(auVar128,local_960,auVar36);
        auVar60 = vfmadd213ps_fma(auVar67,local_980,ZEXT1632(auVar60));
        auVar72 = ZEXT1632(CONCAT412(auVar60._12_4_ + auVar60._12_4_,
                                     CONCAT48(auVar60._8_4_ + auVar60._8_4_,
                                              CONCAT44(auVar60._4_4_ + auVar60._4_4_,
                                                       auVar60._0_4_ + auVar60._0_4_))));
        auVar63._0_4_ = local_940._0_4_ * fVar7;
        auVar63._4_4_ = local_940._4_4_ * fVar8;
        auVar63._8_4_ = local_940._8_4_ * fVar9;
        auVar63._12_4_ = local_940._12_4_ * fVar10;
        auVar63._16_4_ = local_940._16_4_ * fVar11;
        auVar63._20_4_ = local_940._20_4_ * fVar12;
        auVar63._24_4_ = local_940._24_4_ * fVar13;
        auVar63._28_4_ = 0;
        auVar60 = vfmadd213ps_fma(auVar81,local_960,auVar63);
        auVar61 = vfmadd213ps_fma(local_c40,local_980,ZEXT1632(auVar60));
        auVar55 = vrcpps_avx(auVar72);
        auVar89._8_4_ = 0x3f800000;
        auVar89._0_8_ = 0x3f8000003f800000;
        auVar89._12_4_ = 0x3f800000;
        auVar89._16_4_ = 0x3f800000;
        auVar89._20_4_ = 0x3f800000;
        auVar89._24_4_ = 0x3f800000;
        auVar89._28_4_ = 0x3f800000;
        auVar60 = vfnmadd213ps_fma(auVar55,auVar72,auVar89);
        auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar55,auVar55);
        local_9a0 = ZEXT1632(CONCAT412((auVar61._12_4_ + auVar61._12_4_) * auVar60._12_4_,
                                       CONCAT48((auVar61._8_4_ + auVar61._8_4_) * auVar60._8_4_,
                                                CONCAT44((auVar61._4_4_ + auVar61._4_4_) *
                                                         auVar60._4_4_,
                                                         (auVar61._0_4_ + auVar61._0_4_) *
                                                         auVar60._0_4_))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar81._4_4_ = uVar1;
        auVar81._0_4_ = uVar1;
        auVar81._8_4_ = uVar1;
        auVar81._12_4_ = uVar1;
        auVar81._16_4_ = uVar1;
        auVar81._20_4_ = uVar1;
        auVar81._24_4_ = uVar1;
        auVar81._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        local_c60._4_4_ = uVar1;
        local_c60._0_4_ = uVar1;
        local_c60._8_4_ = uVar1;
        local_c60._12_4_ = uVar1;
        local_c60._16_4_ = uVar1;
        local_c60._20_4_ = uVar1;
        local_c60._24_4_ = uVar1;
        local_c60._28_4_ = uVar1;
        auVar55 = vcmpps_avx(auVar81,local_9a0,2);
        auVar86 = vcmpps_avx(local_9a0,local_c60,2);
        auVar55 = vandps_avx(auVar55,auVar86);
        auVar60 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
        auVar59 = vpand_avx(auVar60,auVar59);
        auVar55 = vpmovsxwd_avx2(auVar59);
        if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar55 >> 0x7f,0) != '\0') ||
              (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0xbf,0) != '\0') ||
            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar55[0x1f] < '\0') {
          auVar55 = vcmpps_avx(auVar72,_DAT_01faff00,4);
          auVar60 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
          auVar59 = vpand_avx(auVar59,auVar60);
          local_a00 = vpmovsxwd_avx2(auVar59);
          if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a00 >> 0x7f,0) != '\0') ||
                (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_a00 >> 0xbf,0) != '\0') ||
              (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_a00[0x1f] < '\0') {
            local_b60._4_4_ = *(uint *)(pGVar45 + 0x18);
            local_b80._4_4_ = *(undefined4 *)(pGVar45 + 0x1c);
            local_b20._0_8_ = auVar23._0_8_;
            local_b20._8_8_ = auVar23._8_8_;
            local_a80 = local_b20._0_8_;
            uStack_a78 = local_b20._8_8_;
            uStack_a70 = 0;
            uStack_a68 = 0;
            local_b00._8_8_ = auVar76._8_8_;
            uStack_a38 = local_b00._8_8_;
            uStack_a30 = 0;
            uStack_a28 = 0;
            local_a20 = &local_cb8;
            pGVar47 = (context->scene->geometries).items[local_b60._4_4_].ptr;
            if ((pGVar47->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar47->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005913c6:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar53;
              }
              auVar60 = *(undefined1 (*) [16])(local_cb8 + local_cb0 * 4);
              auVar61 = auVar60;
              if (2 < local_ca8) {
                auVar61 = *(undefined1 (*) [16])(local_cb8 + local_cb0 * 8);
              }
              auVar64 = *(undefined1 (*) [16])local_cb8;
              if (local_cb0 == 2) {
                auVar64 = vpshufd_avx(auVar64,0x54);
                auVar60 = vpshufd_avx(auVar60,0x54);
                auVar61 = vpshufd_avx(auVar61,0x54);
              }
              auVar55 = vrcpps_avx(auVar79);
              auVar82._8_4_ = 0x3f800000;
              auVar82._0_8_ = 0x3f8000003f800000;
              auVar82._12_4_ = 0x3f800000;
              auVar82._16_4_ = 0x3f800000;
              auVar82._20_4_ = 0x3f800000;
              auVar82._24_4_ = 0x3f800000;
              auVar82._28_4_ = 0x3f800000;
              auVar65 = vfnmadd213ps_fma(auVar79,auVar55,auVar82);
              auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar55,auVar55);
              auVar69._8_4_ = 0x219392ef;
              auVar69._0_8_ = 0x219392ef219392ef;
              auVar69._12_4_ = 0x219392ef;
              auVar69._16_4_ = 0x219392ef;
              auVar69._20_4_ = 0x219392ef;
              auVar69._24_4_ = 0x219392ef;
              auVar69._28_4_ = 0x219392ef;
              auVar86 = vcmpps_avx(local_ac0,auVar69,5);
              auVar55 = vandps_avx(auVar86,ZEXT1632(auVar65));
              auVar37._4_4_ = auVar55._4_4_ * auVar23._4_4_;
              auVar37._0_4_ = auVar55._0_4_ * auVar23._0_4_;
              auVar37._8_4_ = auVar55._8_4_ * auVar23._8_4_;
              auVar37._12_4_ = auVar55._12_4_ * auVar23._12_4_;
              auVar37._16_4_ = auVar55._16_4_ * 0.0;
              auVar37._20_4_ = auVar55._20_4_ * 0.0;
              auVar37._24_4_ = auVar55._24_4_ * 0.0;
              auVar37._28_4_ = auVar86._28_4_;
              local_ca0 = vminps_avx(auVar37,auVar82);
              auVar38._4_4_ = auVar54._4_4_ * auVar55._4_4_;
              auVar38._0_4_ = auVar54._0_4_ * auVar55._0_4_;
              auVar38._8_4_ = auVar54._8_4_ * auVar55._8_4_;
              auVar38._12_4_ = auVar54._12_4_ * auVar55._12_4_;
              auVar38._16_4_ = auVar55._16_4_ * 0.0;
              auVar38._20_4_ = auVar55._20_4_ * 0.0;
              auVar38._24_4_ = auVar55._24_4_ * 0.0;
              auVar38._28_4_ = auVar55._28_4_;
              auVar99 = vminps_avx(auVar38,auVar82);
              auVar83._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar64;
              auVar83._16_16_ = ZEXT116(1) * auVar60;
              auVar58._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
              auVar58._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61
              ;
              auVar55 = vpunpckldq_avx2(auVar83,auVar58);
              auVar72 = vpshufd_avx2(auVar83,0xa5);
              auVar81 = vpshufd_avx2(auVar58,0x94);
              auVar86 = vpsrld_avx2(auVar55,0x10);
              auVar55 = vpblendw_avx2(auVar55,ZEXT832(0) << 0x20,0xaa);
              auVar55 = vcvtdq2ps_avx(auVar55);
              auVar86 = vcvtdq2ps_avx(auVar86);
              auVar90 = vpsrld_avx2(auVar72,0x10);
              auVar72 = vpblendw_avx2(auVar72,ZEXT832(0) << 0x20,0xaa);
              auVar72 = vcvtdq2ps_avx(auVar72);
              auVar90 = vcvtdq2ps_avx(auVar90);
              auVar104 = vpsrld_avx2(auVar81,0x10);
              auVar81 = vpblendw_avx2(auVar81,_DAT_01faff00,0xaa);
              auVar81 = vcvtdq2ps_avx(auVar81);
              auVar104 = vcvtdq2ps_avx(auVar104);
              auVar91._8_4_ = 0x3f800000;
              auVar91._0_8_ = 0x3f8000003f800000;
              auVar91._12_4_ = 0x3f800000;
              auVar91._16_4_ = 0x3f800000;
              auVar91._20_4_ = 0x3f800000;
              auVar91._24_4_ = 0x3f800000;
              auVar91._28_4_ = 0x3f800000;
              auVar77 = vsubps_avx(auVar91,local_ca0);
              auVar77 = vsubps_avx(auVar77,auVar99);
              local_9e0._0_4_ =
                   auVar99._0_4_ * auVar81._0_4_ * 0.00012207031 +
                   local_ca0._0_4_ * auVar72._0_4_ * 0.00012207031 +
                   auVar77._0_4_ * auVar55._0_4_ * 0.00012207031;
              local_9e0._4_4_ =
                   auVar99._4_4_ * auVar81._4_4_ * 0.00012207031 +
                   local_ca0._4_4_ * auVar72._4_4_ * 0.00012207031 +
                   auVar77._4_4_ * auVar55._4_4_ * 0.00012207031;
              local_9e0._8_4_ =
                   auVar99._8_4_ * auVar81._8_4_ * 0.00012207031 +
                   local_ca0._8_4_ * auVar72._8_4_ * 0.00012207031 +
                   auVar77._8_4_ * auVar55._8_4_ * 0.00012207031;
              local_9e0._12_4_ =
                   auVar99._12_4_ * auVar81._12_4_ * 0.00012207031 +
                   local_ca0._12_4_ * auVar72._12_4_ * 0.00012207031 +
                   auVar77._12_4_ * auVar55._12_4_ * 0.00012207031;
              local_9e0._16_4_ =
                   auVar99._16_4_ * auVar81._16_4_ * 0.00012207031 +
                   local_ca0._16_4_ * auVar72._16_4_ * 0.00012207031 +
                   auVar77._16_4_ * auVar55._16_4_ * 0.00012207031;
              local_9e0._20_4_ =
                   auVar99._20_4_ * auVar81._20_4_ * 0.00012207031 +
                   local_ca0._20_4_ * auVar72._20_4_ * 0.00012207031 +
                   auVar77._20_4_ * auVar55._20_4_ * 0.00012207031;
              local_9e0._24_4_ =
                   auVar99._24_4_ * auVar81._24_4_ * 0.00012207031 +
                   local_ca0._24_4_ * auVar72._24_4_ * 0.00012207031 +
                   auVar77._24_4_ * auVar55._24_4_ * 0.00012207031;
              local_9e0._28_4_ = auVar81._28_4_ + auVar72._28_4_ + auVar55._28_4_;
              local_9c0._0_4_ =
                   auVar104._0_4_ * 0.00012207031 * auVar99._0_4_ +
                   local_ca0._0_4_ * auVar90._0_4_ * 0.00012207031 +
                   auVar77._0_4_ * auVar86._0_4_ * 0.00012207031;
              local_9c0._4_4_ =
                   auVar104._4_4_ * 0.00012207031 * auVar99._4_4_ +
                   local_ca0._4_4_ * auVar90._4_4_ * 0.00012207031 +
                   auVar77._4_4_ * auVar86._4_4_ * 0.00012207031;
              local_9c0._8_4_ =
                   auVar104._8_4_ * 0.00012207031 * auVar99._8_4_ +
                   local_ca0._8_4_ * auVar90._8_4_ * 0.00012207031 +
                   auVar77._8_4_ * auVar86._8_4_ * 0.00012207031;
              local_9c0._12_4_ =
                   auVar104._12_4_ * 0.00012207031 * auVar99._12_4_ +
                   local_ca0._12_4_ * auVar90._12_4_ * 0.00012207031 +
                   auVar77._12_4_ * auVar86._12_4_ * 0.00012207031;
              local_9c0._16_4_ =
                   auVar104._16_4_ * 0.00012207031 * auVar99._16_4_ +
                   local_ca0._16_4_ * auVar90._16_4_ * 0.00012207031 +
                   auVar77._16_4_ * auVar86._16_4_ * 0.00012207031;
              local_9c0._20_4_ =
                   auVar104._20_4_ * 0.00012207031 * auVar99._20_4_ +
                   local_ca0._20_4_ * auVar90._20_4_ * 0.00012207031 +
                   auVar77._20_4_ * auVar86._20_4_ * 0.00012207031;
              local_9c0._24_4_ =
                   auVar104._24_4_ * 0.00012207031 * auVar99._24_4_ +
                   local_ca0._24_4_ * auVar90._24_4_ * 0.00012207031 +
                   auVar77._24_4_ * auVar86._24_4_ * 0.00012207031;
              local_9c0._28_4_ = auVar72._28_4_ + auVar90._28_4_ + auVar55._28_4_;
              auVar92 = ZEXT3264(local_c60);
              if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar23 = vpacksswb_avx(auVar59,auVar59);
                uVar44 = 0;
                uVar43 = (ulong)(byte)(SUB161(auVar23 >> 7,0) & 1 |
                                       (SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar23 >> 0x3f,0) << 7);
                for (uVar40 = uVar43; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  uVar44 = uVar44 + 1;
                }
                local_b60._0_4_ = local_b60._4_4_;
                uStack_b58._0_4_ = local_b60._4_4_;
                uStack_b58._4_4_ = local_b60._4_4_;
                uStack_b50._0_4_ = local_b60._4_4_;
                uStack_b50._4_4_ = local_b60._4_4_;
                uStack_b48._0_4_ = local_b60._4_4_;
                uStack_b48._4_4_ = local_b60._4_4_;
                local_b80._0_4_ = local_b80._4_4_;
                uStack_b78._0_4_ = local_b80._4_4_;
                uStack_b78._4_4_ = local_b80._4_4_;
                uStack_b70._0_4_ = local_b80._4_4_;
                uStack_b70._4_4_ = local_b80._4_4_;
                uStack_b68._0_4_ = local_b80._4_4_;
                uStack_b68._4_4_ = local_b80._4_4_;
                auStack_bb8 = auVar106._8_24_;
                local_bc0 = pGVar47;
                local_b20 = auVar120;
                local_b00 = auVar79;
                fStack_a9c = local_aa0;
                fStack_a98 = local_aa0;
                fStack_a94 = local_aa0;
                fStack_a90 = local_aa0;
                fStack_a8c = local_aa0;
                fStack_a88 = local_aa0;
                fStack_a84 = local_aa0;
                local_a60 = local_ba0;
                local_a40 = auVar76._0_8_;
                do {
                  local_8c0 = *(undefined4 *)(local_9e0 + uVar44 * 4);
                  local_8a0 = *(undefined4 *)(local_9c0 + uVar44 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + uVar44 * 4);
                  uVar1 = *(undefined4 *)(local_980 + uVar44 * 4);
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  local_900 = *(undefined4 *)(local_960 + uVar44 * 4);
                  local_8e0 = *(undefined4 *)(local_940 + uVar44 * 4);
                  local_bf0.context = context->user;
                  local_920[0] = (RTCHitN)(char)uVar1;
                  local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar1;
                  local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar1;
                  local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar1;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar1;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar1;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar1;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar1;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  local_880 = local_b80;
                  uStack_878 = uStack_b78;
                  uStack_870 = uStack_b70;
                  uStack_868 = uStack_b68;
                  local_860 = local_b60;
                  uStack_858 = uStack_b58;
                  uStack_850 = uStack_b50;
                  uStack_848 = uStack_b48;
                  auVar55 = vpcmpeqd_avx2(auVar70,auVar70);
                  uStack_83c = (local_bf0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_bf0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b40 = local_ae0;
                  local_bf0.valid = (int *)local_b40;
                  local_bf0.geometryUserPtr = pGVar47->userPtr;
                  local_bf0.hit = local_920;
                  local_bf0.N = 8;
                  uVar40 = uVar44;
                  local_bf0.ray = (RTCRayN *)ray;
                  if (pGVar47->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_c40._0_8_ = uVar44;
                    local_ca0._0_8_ = uVar43;
                    auVar55 = ZEXT1632(auVar55._0_16_);
                    (*pGVar47->occlusionFilterN)(&local_bf0);
                    auVar92 = ZEXT3264(local_c60);
                    auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                    uVar43 = local_ca0._0_8_;
                    uVar40 = local_c40._0_8_;
                    pGVar47 = local_bc0;
                  }
                  auVar72 = vpcmpeqd_avx2(local_b40,_DAT_01faff00);
                  auVar86 = auVar55 & ~auVar72;
                  if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar86 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar86 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar86 >> 0x7f,0) == '\0') &&
                        (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar86 >> 0xbf,0) == '\0') &&
                      (auVar86 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar86[0x1f]) {
                    auVar72 = auVar72 ^ auVar55;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar47->field_8).field_0x2 & 0x40) != 0)))) {
                      local_c40._0_8_ = uVar40;
                      local_ca0._0_8_ = uVar43;
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*p_Var6)(&local_bf0);
                      auVar92 = ZEXT3264(local_c60);
                      auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                      uVar43 = local_ca0._0_8_;
                      uVar40 = local_c40._0_8_;
                      pGVar47 = local_bc0;
                    }
                    auVar86 = vpcmpeqd_avx2(local_b40,_DAT_01faff00);
                    auVar72 = auVar86 ^ auVar55;
                    auVar71._8_4_ = 0xff800000;
                    auVar71._0_8_ = 0xff800000ff800000;
                    auVar71._12_4_ = 0xff800000;
                    auVar71._16_4_ = 0xff800000;
                    auVar71._20_4_ = 0xff800000;
                    auVar71._24_4_ = 0xff800000;
                    auVar71._28_4_ = 0xff800000;
                    auVar55 = vblendvps_avx(auVar71,*(undefined1 (*) [32])(local_bf0.ray + 0x100),
                                            auVar86);
                    *(undefined1 (*) [32])(local_bf0.ray + 0x100) = auVar55;
                  }
                  if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar72 >> 0x7f,0) != '\0') ||
                        (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar72 >> 0xbf,0) != '\0') ||
                      (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar72[0x1f] < '\0') goto LAB_005913c6;
                  *(int *)(ray + k * 4 + 0x100) = auVar92._0_4_;
                  uVar44 = 0;
                  uVar43 = uVar43 ^ 1L << (uVar40 & 0x3f);
                  for (uVar40 = uVar43; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    uVar44 = uVar44 + 1;
                  }
                  fVar87 = local_c10;
                  fVar94 = fStack_c0c;
                  fVar95 = fStack_c08;
                  fVar96 = fStack_c04;
                  fVar93 = local_c00;
                  fVar97 = fStack_bfc;
                  fVar98 = fStack_bf8;
                  fVar74 = fStack_bf4;
                } while (uVar43 != 0);
              }
            }
          }
        }
      }
    }
    else {
      pGVar45 = (GridSOA *)(uVar44 & 0xfffffffffffffff0);
      uVar44 = *(ulong *)(pGVar45 + (ulong)*(uint *)(pGVar45 + 0x2c) + 0x30);
      (pre->super_Precalculations).grid = pGVar45;
      if (uVar44 != 0) {
        *puVar48 = uVar44;
        puVar48 = puVar48 + 1;
      }
    }
LAB_00591337:
    bVar53 = puVar48 != &local_800;
    if (!bVar53) {
      return bVar53;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }